

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O2

void __thiscall TextBuffer::TextBuffer(TextBuffer *this)

{
  Layer *this_00;
  Text TStack_48;
  
  this_00 = (Layer *)operator_new(0xa0);
  Text::Text(&TStack_48);
  Layer::Layer(this_00,&TStack_48);
  Text::~Text(&TStack_48);
  this->base_layer = this_00;
  this->top_layer = this_00;
  return;
}

Assistant:

TextBuffer::TextBuffer() :
  base_layer{new Layer(Text{})},
  top_layer{base_layer} {}